

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SinOp>_>
::tokenize(UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SinOp>_>
           *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *this_00;
  Token local_40;
  Token local_30;
  
  Token::Token(&local_40,(this->m_function)._M_dataplus._M_p);
  this_00 = TokenStream::operator<<(str,&local_40);
  local_30.m_type = LEFT_PAREN;
  TokenStream::operator<<(this_00,&local_30);
  Token::~Token(&local_30);
  Token::~Token(&local_40);
  (*this->m_child->_vptr_Expression[3])(this->m_child,state,str);
  local_40.m_type = RIGHT_PAREN;
  TokenStream::operator<<(str,&local_40);
  Token::~Token(&local_40);
  return;
}

Assistant:

void UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::tokenize (GeneratorState& state, TokenStream& str) const
{
	str << Token(m_function.c_str()) << Token::LEFT_PAREN;
	m_child->tokenize(state, str);
	str << Token::RIGHT_PAREN;
}